

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int wally_psbt_get_global_tx_alloc(wally_psbt *psbt,wally_tx **output)

{
  wally_tx **output_local;
  wally_psbt *psbt_local;
  
  if (output == (wally_tx **)0x0) {
    psbt_local._4_4_ = -2;
  }
  else {
    *output = (wally_tx *)0x0;
    if (psbt == (wally_psbt *)0x0) {
      psbt_local._4_4_ = -2;
    }
    else if (psbt->tx == (wally_tx *)0x0) {
      psbt_local._4_4_ = 0;
    }
    else {
      psbt_local._4_4_ = tx_clone_alloc(psbt->tx,output);
    }
  }
  return psbt_local._4_4_;
}

Assistant:

int wally_psbt_get_global_tx_alloc(const struct wally_psbt *psbt, struct wally_tx **output)
{
    TX_CHECK_OUTPUT;
    if (!psbt)
        return WALLY_EINVAL;
    if (!psbt->tx)
        return WALLY_OK; /* Return a NULL tx if not present */
    return tx_clone_alloc(psbt->tx, output);
}